

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int ecdh_gen_public_restartable
              (mbedtls_ecp_group *grp,mbedtls_mpi *d,mbedtls_ecp_point *Q,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,mbedtls_ecp_restart_ctx *rs_ctx
              )

{
  int local_3c;
  int restarting;
  int ret;
  mbedtls_ecp_restart_ctx *rs_ctx_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_ecp_point *Q_local;
  mbedtls_mpi *d_local;
  mbedtls_ecp_group *grp_local;
  
  local_3c = mbedtls_ecp_gen_privkey(grp,d,f_rng,p_rng);
  if (local_3c == 0) {
    local_3c = mbedtls_ecp_mul_restartable(grp,Q,d,&grp->G,f_rng,p_rng,rs_ctx);
  }
  return local_3c;
}

Assistant:

static int ecdh_gen_public_restartable(mbedtls_ecp_group *grp,
                                       mbedtls_mpi *d, mbedtls_ecp_point *Q,
                                       int (*f_rng)(void *, unsigned char *, size_t),
                                       void *p_rng,
                                       mbedtls_ecp_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    int restarting = 0;
#if defined(MBEDTLS_ECP_RESTARTABLE)
    restarting = (rs_ctx != NULL && rs_ctx->rsm != NULL);
#endif
    /* If multiplication is in progress, we already generated a privkey */
    if (!restarting) {
        MBEDTLS_MPI_CHK(mbedtls_ecp_gen_privkey(grp, d, f_rng, p_rng));
    }

    MBEDTLS_MPI_CHK(mbedtls_ecp_mul_restartable(grp, Q, d, &grp->G,
                                                f_rng, p_rng, rs_ctx));

cleanup:
    return ret;
}